

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.cpp
# Opt level: O3

bool __thiscall ParsedJson::iterator::next(iterator *this)

{
  uint8_t uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  
  uVar1 = this->current_type;
  if (uVar1 == '{') {
LAB_00108195:
    uVar3 = this->current_val & 0xffffffffffffff;
  }
  else {
    if (uVar1 == 'd') {
      lVar4 = 2;
    }
    else {
      if (uVar1 == '[') goto LAB_00108195;
      lVar4 = (ulong)(uVar1 == 'l') + 1;
    }
    uVar3 = lVar4 + this->location;
  }
  if ((uVar3 < this->tape_length) &&
     (uVar2 = this->pj->tape[uVar3], (uVar2 & 0xdf00000000000000) != 0x5d00000000000000)) {
    this->location = uVar3;
    this->current_val = uVar2;
    this->current_type = (uint8_t)(uVar2 >> 0x38);
    return true;
  }
  return false;
}

Assistant:

bool ParsedJson::iterator::next() {
    if ((current_type == '[') || (current_type == '{')){
    // we need to jump
    size_t npos = ( current_val & JSONVALUEMASK);
    if(npos >= tape_length) {
        return false; // shoud never happen unless at the root
    }
    uint64_t nextval = pj.tape[npos];
    uint8_t nexttype = (nextval >> 56);
    if((nexttype == ']') || (nexttype == '}')) {
        return false; // we reached the end of the scope
    }
    location = npos;
    current_val = nextval;
    current_type = nexttype;
    return true;
    } 
    size_t increment = (current_type == 'd' || current_type == 'l') ? 2 : 1;
    if(location + increment >= tape_length) { return false;
}
    uint64_t nextval = pj.tape[location + increment];
    uint8_t nexttype = (nextval >> 56);
    if((nexttype == ']') || (nexttype == '}')) {
        return false; // we reached the end of the scope
    }
    location = location + increment;
    current_val = nextval;
    current_type = nexttype;
    return true;
    
}